

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::Imputer::MergePartialFromCodedStream(Imputer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  StringToDoubleMap *value;
  Int64ToDoubleMap *value_00;
  DoubleVector *pDVar5;
  Int64Vector *value_01;
  string *psVar6;
  undefined8 *puVar7;
  char *field_name;
  char cVar8;
  int size;
  ulong uVar9;
  _func_int **data;
  
LAB_0019a0f8:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_0019a11b;
    input->buffer_ = pbVar2 + 1;
    uVar9 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_0019a11b:
    uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar9 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar9 = 0x100000000;
    }
    uVar9 = uVar4 | uVar9;
  }
  uVar4 = (uint32)uVar9;
  if ((uVar9 & 0x100000000) == 0) goto switchD_0019a179_caseD_8;
  cVar8 = (char)uVar9;
  switch((uint)(uVar9 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar8 == '\t') {
      clear_ImputedValue(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                        (input,&(this->ImputedValue_).imputeddoublevalue_);
      if (!bVar3) {
        return false;
      }
      this->_oneof_case_[0] = 1;
      goto LAB_0019a0f8;
    }
    break;
  case 2:
    if (cVar8 == '\x10') {
      clear_ImputedValue(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                        (input,&(this->ImputedValue_).imputedint64value_);
      if (!bVar3) {
        return false;
      }
      this->_oneof_case_[0] = 2;
      goto LAB_0019a0f8;
    }
    break;
  case 3:
    if (cVar8 != '\x1a') break;
    psVar6 = mutable_imputedstringvalue_abi_cxx11_(this);
    bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar3) {
      return false;
    }
    pDVar5 = (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if (this->_oneof_case_[0] == 3) {
      pDVar5 = (this->ImputedValue_).imputeddoublearray_;
    }
    data = (pDVar5->super_MessageLite)._vptr_MessageLite;
    size = *(int *)&(pDVar5->_internal_metadata_).
                    super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                    .ptr_;
    field_name = "CoreML.Specification.Imputer.imputedStringValue";
LAB_0019a325:
    bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((char *)data,size,PARSE,field_name);
    if (!bVar3) {
      return false;
    }
    goto LAB_0019a0f8;
  case 4:
    if (cVar8 != '\"') break;
    pDVar5 = mutable_imputeddoublearray(this);
    bVar3 = google::protobuf::internal::WireFormatLite::
            ReadMessageNoVirtual<CoreML::Specification::DoubleVector>(input,pDVar5);
    goto LAB_0019a15d;
  case 5:
    if (cVar8 == '*') {
      value_01 = mutable_imputedint64array(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_01);
      goto LAB_0019a15d;
    }
    break;
  case 6:
    if (cVar8 == '2') {
      value = mutable_imputedstringdictionary(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::StringToDoubleMap>(input,value);
      goto LAB_0019a15d;
    }
    break;
  case 7:
    if (cVar8 == ':') {
      value_00 = mutable_imputedint64dictionary(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::Int64ToDoubleMap>(input,value_00);
      goto LAB_0019a15d;
    }
    break;
  case 0xb:
    if (cVar8 == 'Y') {
      clear_ReplaceValue(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                        (input,&(this->ReplaceValue_).replacedoublevalue_);
      if (!bVar3) {
        return false;
      }
      this->_oneof_case_[1] = 0xb;
      goto LAB_0019a0f8;
    }
    break;
  case 0xc:
    if (cVar8 == '`') {
      clear_ReplaceValue(this);
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                        (input,&(this->ReplaceValue_).replaceint64value_);
      if (!bVar3) {
        return false;
      }
      this->_oneof_case_[1] = 0xc;
      goto LAB_0019a0f8;
    }
    break;
  case 0xd:
    if (cVar8 == 'j') {
      psVar6 = mutable_replacestringvalue_abi_cxx11_(this);
      bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
      if (!bVar3) {
        return false;
      }
      puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if (this->_oneof_case_[1] == 0xd) {
        puVar7 = (undefined8 *)(this->ReplaceValue_).replaceint64value_;
      }
      data = (_func_int **)*puVar7;
      size = *(int *)(puVar7 + 1);
      field_name = "CoreML.Specification.Imputer.replaceStringValue";
      goto LAB_0019a325;
    }
  }
switchD_0019a179_caseD_8:
  if (uVar4 == 0) {
    return true;
  }
  if ((uVar4 & 7) == 4) {
    return true;
  }
  bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_0019a15d:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_0019a0f8;
}

Assistant:

bool Imputer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Imputer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double imputedDoubleValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(9u)) {
          clear_ImputedValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &ImputedValue_.imputeddoublevalue_)));
          set_has_imputeddoublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 imputedInt64Value = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          clear_ImputedValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &ImputedValue_.imputedint64value_)));
          set_has_imputedint64value();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string imputedStringValue = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_imputedstringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->imputedstringvalue().data(), this->imputedstringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Imputer.imputedStringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputeddoublearray()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedint64array()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedstringdictionary()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedint64dictionary()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double replaceDoubleValue = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(89u)) {
          clear_ReplaceValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &ReplaceValue_.replacedoublevalue_)));
          set_has_replacedoublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 replaceInt64Value = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          clear_ReplaceValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &ReplaceValue_.replaceint64value_)));
          set_has_replaceint64value();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string replaceStringValue = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_replacestringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->replacestringvalue().data(), this->replacestringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Imputer.replaceStringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Imputer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Imputer)
  return false;
#undef DO_
}